

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool mjs::interpreter::impl::compare_equal(value *l,value *r)

{
  value_type vVar1;
  value_type vVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  gc_heap_ptr_untyped *pgVar7;
  void *pvVar8;
  void *pvVar9;
  string *psVar10;
  string *r_00;
  double dVar11;
  value local_60;
  double local_38;
  
  vVar1 = l->type_;
  vVar2 = r->type_;
  if (vVar1 == vVar2) {
    switch(vVar1) {
    case undefined:
    case null:
switchD_00121743_caseD_0:
      bVar5 = 1;
      break;
    case boolean:
      bVar4 = value::boolean_value(l);
      bVar6 = value::boolean_value(r);
      bVar5 = bVar6 == bVar4;
      break;
    case number:
      local_38 = value::number_value(l);
      dVar11 = value::number_value(r);
      if (!NAN(local_38) && !NAN(dVar11)) {
        bVar5 = local_38 == dVar11 | -(local_38 == 0.0) & -(dVar11 == 0.0);
        break;
      }
LAB_001219af:
      bVar5 = 0;
      break;
    case string:
      psVar10 = value::string_value(l);
      r_00 = value::string_value(r);
      bVar4 = operator==(psVar10,r_00);
      return bVar4;
    case object:
      pgVar7 = &value::object_value(l)->super_gc_heap_ptr_untyped;
      pvVar8 = gc_heap_ptr_untyped::get(pgVar7);
      pgVar7 = &value::object_value(r)->super_gc_heap_ptr_untyped;
      pvVar9 = gc_heap_ptr_untyped::get(pgVar7);
      bVar5 = pvVar8 == pvVar9;
      break;
    default:
      __assert_fail("l.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x292,
                    "static bool mjs::interpreter::impl::compare_equal(const value &, const value &)"
                   );
    }
  }
  else {
    switch(vVar1) {
    case undefined:
      bVar5 = 1;
      if (vVar2 == null) goto LAB_0012198d;
      break;
    case null:
      if (vVar2 == undefined) goto switchD_00121743_caseD_0;
      break;
    case boolean:
      bVar4 = value::boolean_value(l);
      local_60.field_1.n_ = (double)bVar4;
      local_60.type_ = number;
      bVar5 = compare_equal(&local_60,r);
      goto LAB_00121981;
    case number:
      if (vVar2 == string) {
        psVar10 = value::string_value(r);
        local_60.field_1.n_ = to_number(psVar10);
        local_60.type_ = number;
        bVar5 = compare_equal(l,&local_60);
        goto LAB_00121981;
      }
      bVar3 = 1;
      goto LAB_0012181b;
    case string:
      if (vVar2 == number) {
        psVar10 = value::string_value(l);
        local_60.field_1.n_ = to_number(psVar10);
        local_60.type_ = number;
        bVar5 = compare_equal(&local_60,r);
        goto LAB_00121981;
      }
      bVar5 = 1;
      bVar3 = 0;
      goto LAB_0012181d;
    }
    bVar3 = 0;
LAB_0012181b:
    bVar5 = 0;
LAB_0012181d:
    if (vVar2 == boolean) {
      bVar4 = value::boolean_value(r);
      local_60.field_1.n_ = (double)bVar4;
      local_60.type_ = number;
      bVar5 = compare_equal(l,&local_60);
    }
    else if (vVar2 == object && (bool)(bVar3 | bVar5)) {
      to_primitive(&local_60,r,undefined);
      bVar5 = compare_equal(l,&local_60);
    }
    else {
      if (vVar1 != object || 1 < vVar2 - number) goto LAB_001219af;
      to_primitive(&local_60,l,undefined);
      bVar5 = compare_equal(&local_60,r);
    }
LAB_00121981:
    value::~value(&local_60);
  }
LAB_0012198d:
  return (bool)(bVar5 & 1);
}

Assistant:

static bool compare_equal(const value& l, const value& r) {
        if (l.type() == r.type()) {
            if (l.type() == value_type::undefined || l.type() == value_type::null) {
                return true;
            } else if (l.type() == value_type::number) {
                const double ln = l.number_value();
                const double rn = r.number_value();
                if (std::isnan(ln) || std::isnan(rn)) {
                    return false;
                }
                if ((ln == 0.0 && rn == 0.0) || ln == rn) {
                    return true;
                }
                return false;
            } else if (l.type() == value_type::string) {
                return l.string_value() == r.string_value();
            } else if (l.type() == value_type::boolean) {
                return l.boolean_value() == r.boolean_value();
            }
            assert(l.type() == value_type::object);
            return l.object_value().get() == r.object_value().get();
        }
        // Types are different
        if (l.type() == value_type::null && r.type() == value_type::undefined) {
            return true;
        } else if (l.type() == value_type::undefined && r.type() == value_type::null) {
            return true;
        } else if (l.type() == value_type::number && r.type() == value_type::string) {
            return compare_equal(l, value{to_number(r.string_value())});
        } else if (l.type() == value_type::string && r.type() == value_type::number) {
            return compare_equal(value{to_number(l.string_value())}, r);
        } else if (l.type() == value_type::boolean) {
            return compare_equal(value{static_cast<double>(l.boolean_value())}, r);
        } else if (r.type() == value_type::boolean) {
            return compare_equal(l, value{static_cast<double>(r.boolean_value())});
        } else if ((l.type() == value_type::string || l.type() == value_type::number) && r.type() == value_type::object) {
            return compare_equal(l, to_primitive(r));
        } else if ((r.type() == value_type::string || r.type() == value_type::number) && l.type() == value_type::object) {
            return compare_equal(to_primitive(l), r);
        }
        return false;
    }